

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O3

bool __thiscall
ICM::Compiler::InstructionCreater::createNodeIfe
          (InstructionCreater *this,Node *node,Element *refelt)

{
  InstructionList *this_00;
  pointer pEVar1;
  uint_t uVar2;
  InstructionData *instdata;
  InstructionData *instdata_00;
  
  pEVar1 = (node->super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
           super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>._M_impl
           .super__Vector_impl_data._M_start;
  createReferNode(this,pEVar1 + 1);
  instdata = (InstructionData *)operator_new(0x28);
  instdata->_vptr_InstructionData = (_func_int **)0x0;
  *(undefined8 *)&instdata->Inst = 0;
  instdata[1]._vptr_InstructionData = (_func_int **)0x0;
  *(undefined8 *)&instdata[1].Inst = 0;
  instdata[2]._vptr_InstructionData = (_func_int **)0x0;
  instdata->Inst = jmpn;
  instdata->_vptr_InstructionData = (_func_int **)&PTR_getToString_abi_cxx11__00151e98;
  uVar2 = pEVar1[1].index;
  *(anon_union_4_2_4727c1b0_for_Element_0 *)&instdata[1]._vptr_InstructionData = pEVar1[1].field_0;
  *(uint_t *)&instdata[1].Inst = uVar2;
  this_00 = &this->InstList;
  Instruction::InstructionList::push(this_00,instdata);
  createReferNodeAndSingleElement(this,pEVar1 + 2);
  instdata_00 = (InstructionData *)operator_new(0x18);
  instdata_00->_vptr_InstructionData = (_func_int **)0x0;
  *(undefined8 *)&instdata_00->Inst = 0;
  instdata_00[1]._vptr_InstructionData = (_func_int **)0x0;
  instdata_00->Inst = jump;
  instdata_00->_vptr_InstructionData = (_func_int **)&PTR_getToString_abi_cxx11__00151e50;
  Instruction::InstructionList::push(this_00,instdata_00);
  instdata[2]._vptr_InstructionData =
       (_func_int **)
       ((long)(this->InstList).
              super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
              .
              super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->InstList).
              super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
              .
              super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3);
  createReferNodeAndSingleElement(this,pEVar1 + 3);
  instdata_00[1]._vptr_InstructionData =
       (_func_int **)
       ((long)(this->InstList).
              super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
              .
              super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->InstList).
              super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
              .
              super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3);
  Instruction::InstructionList::push(this_00,sing);
  if ((refelt->field_0).field_0.etype == '\x02') {
    refelt->index =
         ((long)(this->InstList).
                super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                .
                super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->InstList).
                super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                .
                super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3) - 1;
    return true;
  }
  __assert_fail("isRefer()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Chill-Language[P]ICM/include/parser/ast.h"
                ,0x34,"void ICM::ASTBase::Element::setRefer(size_t)");
}

Assistant:

bool createNodeIfe(Node &node, Element &refelt) {
				Element &Bexp = node[1];
				Element &E1 = node[2];
				Element &E2 = node[3];

				createReferNode(Bexp);

				auto *inst = new Insts::JumpNot();
				inst->Data = ConvertToInstElement(Bexp);
				InstList.push(inst);

				createReferNodeAndSingleElement(E1);


				auto *instje = new Insts::Jump();
				InstList.push(instje);
				inst->Index = NextInstID();

				createReferNodeAndSingleElement(E2);

				instje->Index = NextInstID();

				InstList.push(sing);

				refelt.setRefer(CurrInstID());
				return true;
			}